

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> * chrono::Qsub(ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  undefined1 auVar1 [32];
  ChQuaternion<double> *result;
  ChQuaternion<double> *in_RDI;
  
  auVar1 = vsubpd_avx(*(undefined1 (*) [32])qa->m_data,*(undefined1 (*) [32])qb->m_data);
  *(undefined1 (*) [32])in_RDI->m_data = auVar1;
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qsub(const ChQuaternion<double>& qa, const ChQuaternion<double>& qb) {
    ChQuaternion<double> result;
    result.e0() = qa.e0() - qb.e0();
    result.e1() = qa.e1() - qb.e1();
    result.e2() = qa.e2() - qb.e2();
    result.e3() = qa.e3() - qb.e3();
    return result;
}